

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O2

int64_t get_sse(AV1_COMP *cpi,MACROBLOCK *x,int64_t *sse_y)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  uint sse;
  uint local_54;
  ulong *local_50;
  MB_MODE_INFO *local_48;
  AV1_COMP *local_40;
  long local_38;
  
  local_48 = *(x->e_mbd).mi;
  local_38 = 0x88;
  if (((cpi->common).seq_params)->monochrome == '\0') {
    local_38 = 0x198;
  }
  piVar1 = &(x->e_mbd).plane[0].subsampling_x;
  lVar3 = 0;
  lVar2 = 0;
  local_50 = (ulong *)sse_y;
  local_40 = cpi;
  while ((local_38 != lVar3 && ((lVar3 == 0 || ((x->e_mbd).is_chroma_ref == true))))) {
    bVar4 = local_50 != (ulong *)0x0;
    (*local_40->ppi->fn_ptr[av1_ss_size_lookup[local_48->bsize][*piVar1][piVar1[1]]].vf)
              (*(uint8_t **)((long)&x->plane[0].src.buf + lVar3),
               *(int *)((long)&x->plane[0].src.stride + lVar3),((buf_2d *)(piVar1 + 3))->buf,
               piVar1[9],&local_54);
    if (bVar4 && lVar3 == 0) {
      *local_50 = (ulong)local_54;
    }
    lVar2 = lVar2 + (ulong)local_54;
    lVar3 = lVar3 + 0x88;
    piVar1 = piVar1 + 0x28c;
  }
  return lVar2 << 4;
}

Assistant:

static int64_t get_sse(AV1_COMP *const cpi, BLOCK_SIZE bsize, int mi_row,
                       int mi_col) {
  AV1_COMMON *const cm = &cpi->common;
  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];

  const int mi_step = mi_size_wide[cpi->weber_bsize];
  int mb_stride = cpi->frame_info.mi_cols;
  int mb_count = 0;
  int64_t distortion = 0;

  for (int row = mi_row; row < mi_row + mi_high; row += mi_step) {
    for (int col = mi_col; col < mi_col + mi_wide; col += mi_step) {
      if (row >= cm->mi_params.mi_rows || col >= cm->mi_params.mi_cols)
        continue;

      distortion +=
          cpi->mb_weber_stats[(row / mi_step) * mb_stride + (col / mi_step)]
              .distortion;
      ++mb_count;
    }
  }

  if (mb_count) distortion = (int)(distortion / mb_count);
  distortion = AOMMAX(1, distortion);

  return (int)distortion;
}